

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

shared_ptr<kratos::FSMState> __thiscall kratos::FSM::add_state(FSM *this,string *name)

{
  iterator iVar1;
  UserException *this_00;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::FSMState> sVar2;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args;
  string local_58;
  pointer local_38;
  size_type sStack_30;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>_>
                  *)(name + 4),in_RDX);
  if (iVar1._M_node == (_Base_ptr)&name[4]._M_string_length) {
    local_58._M_dataplus._M_p = (pointer)name;
    std::make_shared<kratos::FSMState,std::__cxx11::string_const&,kratos::FSM*>
              (&this->fsm_name_,(FSM **)in_RDX);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSMState>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSMState>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSMState>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::FSMState>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSMState>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSMState>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FSMState>>>>
                *)(name + 4),in_RDX,(shared_ptr<kratos::FSMState> *)this);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               name[5].field_2._M_local_buf,in_RDX);
    sVar2.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<kratos::FSMState>)
           sVar2.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_38 = (in_RDX->_M_dataplus)._M_p;
  sStack_30 = in_RDX->_M_string_length;
  bVar3 = fmt::v7::to_string_view<char,_0>("{0} already exists in the FSM");
  format_str.data_ = (char *)bVar3.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_38;
  fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)bVar3.data_,format_str,args);
  UserException::UserException(this_00,&local_58);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<FSMState> FSM::add_state(const std::string& name) {
    if (states_.find(name) != states_.end())
        throw UserException(::format("{0} already exists in the FSM", name));
    auto ptr = std::make_shared<FSMState>(name, this);
    states_.emplace(name, ptr);
    state_names_.emplace_back(name);
    return ptr;
}